

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_ea566c::RawDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,RawDescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *param_1,Span<const_CScript> param_2,
          FlatSigningProvider *param_3)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    Vector<CScript_const&>(__return_storage_ptr__,&this->m_script);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>&, Span<const CScript>, FlatSigningProvider&) const override { return Vector(m_script); }